

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCustomCommandGenerator.cxx
# Opt level: O2

char * __thiscall cmCustomCommandGenerator::GetArgv0Location(cmCustomCommandGenerator *this,uint c)

{
  cmMakefile *this_00;
  bool bVar1;
  TargetType TVar2;
  cmGeneratorTarget *this_01;
  char *pcVar3;
  allocator local_62;
  allocator local_61;
  string local_60;
  string local_40;
  
  this_01 = cmLocalGenerator::FindGeneratorTargetToUse
                      (this->LG,*(string **)
                                 &(this->CommandLines).
                                  super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>
                                  .
                                  super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>
                                  ._M_impl.super__Vector_impl_data._M_start[c].
                                  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  .
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      );
  if ((this_01 != (cmGeneratorTarget *)0x0) &&
     (TVar2 = cmGeneratorTarget::GetType(this_01), TVar2 == EXECUTABLE)) {
    bVar1 = cmGeneratorTarget::IsImported(this_01);
    if (!bVar1) {
      std::__cxx11::string::string((string *)&local_40,"CROSSCOMPILING_EMULATOR",&local_61);
      pcVar3 = cmGeneratorTarget::GetProperty(this_01,&local_40);
      if (pcVar3 == (char *)0x0) {
        this_00 = this->LG->Makefile;
        std::__cxx11::string::string((string *)&local_60,"CMAKE_CROSSCOMPILING",&local_62);
        bVar1 = cmMakefile::IsOn(this_00,&local_60);
        std::__cxx11::string::~string((string *)&local_60);
        std::__cxx11::string::~string((string *)&local_40);
        if (bVar1) {
          return (char *)0x0;
        }
      }
      else {
        std::__cxx11::string::~string((string *)&local_40);
      }
    }
    pcVar3 = cmGeneratorTarget::GetLocation(this_01,&this->Config);
    return pcVar3;
  }
  return (char *)0x0;
}

Assistant:

const char* cmCustomCommandGenerator::GetArgv0Location(unsigned int c) const
{
  std::string const& argv0 = this->CommandLines[c][0];
  cmGeneratorTarget* target = this->LG->FindGeneratorTargetToUse(argv0);
  if (target && target->GetType() == cmStateEnums::EXECUTABLE &&
      (target->IsImported() ||
       target->GetProperty("CROSSCOMPILING_EMULATOR") ||
       !this->LG->GetMakefile()->IsOn("CMAKE_CROSSCOMPILING"))) {
    return target->GetLocation(this->Config);
  }
  return CM_NULLPTR;
}